

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfScanLineInputFile.cpp
# Opt level: O0

void __thiscall
Imf_3_3::ScanLineInputFile::Data::LineBufferTask::LineBufferTask
          (LineBufferTask *this,TaskGroup *group,Data *ifd,ScanLineProcessGroup *lineg,
          FrameBuffer *outfb,exr_chunk_info_t *cinfo,int fby,int endScan)

{
  Process *pPVar1;
  Data *in_RCX;
  Data *in_RDX;
  TaskGroup *in_RDI;
  Data *in_R8;
  void *in_R9;
  undefined4 in_stack_00000008;
  undefined4 in_stack_00000010;
  Task *in_stack_ffffffffffffffb0;
  TaskGroup *pTVar2;
  ProcessGroup<Imf_3_3::(anonymous_namespace)::ScanLineProcess,_true> *in_stack_ffffffffffffffc0;
  
  IlmThread_3_3::Task::Task(in_stack_ffffffffffffffb0,in_RDI);
  in_RDI->_data = (Data *)&PTR__LineBufferTask_004f4e48;
  in_RDI[2]._data = in_R8;
  in_RDI[3]._data = in_RDX;
  *(undefined4 *)&in_RDI[4]._data = in_stack_00000008;
  *(undefined4 *)((long)&in_RDI[4]._data + 4) = in_stack_00000010;
  pTVar2 = in_RDI + 5;
  pPVar1 = IlmThread_3_3::ProcessGroup<Imf_3_3::(anonymous_namespace)::ScanLineProcess,_true>::pop
                     (in_stack_ffffffffffffffc0);
  pTVar2->_data = (Data *)pPVar1;
  in_RDI[6]._data = in_RCX;
  memcpy(&(in_RDI[5]._data)->isEmpty,in_R9,0x40);
  return;
}

Assistant:

LineBufferTask (
            ILMTHREAD_NAMESPACE::TaskGroup* group,
            Data*                   ifd,
            ScanLineProcessGroup*   lineg,
            const FrameBuffer*      outfb,
            const exr_chunk_info_t& cinfo,
            int                     fby,
            int                     endScan)
            : Task (group)
            , _outfb (outfb)
            , _ifd (ifd)
            , _fby (fby)
            , _last_fby (endScan)
            , _line (lineg->pop ())
            , _line_group (lineg)
        {
            _line->cinfo = cinfo;
        }